

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::returnFromLexicographicOptimization
          (Highs *this,HighsStatus return_status,HighsInt original_lp_num_row)

{
  undefined4 uVar1;
  size_type sVar2;
  HighsStatus in_ESI;
  long in_RDI;
  HighsInt num_linear_objective;
  HighsInfo info;
  HighsModelStatus model_status;
  HighsInfo *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  HighsInfo *in_stack_ffffffffffffff18;
  HighsInfo *in_stack_ffffffffffffff20;
  HighsInt in_stack_ffffffffffffff80;
  HighsInt in_stack_ffffffffffffff84;
  Highs *in_stack_ffffffffffffff88;
  
  uVar1 = *(undefined4 *)(in_RDI + 0x1244);
  HighsInfo::HighsInfo(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  sVar2 = std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::size
                    ((vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_> *)
                     (in_RDI + 0x520));
  if (1 < (int)sVar2) {
    deleteRows(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    *(undefined4 *)(in_RDI + 0x1244) = uVar1;
    HighsInfo::operator=
              ((HighsInfo *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    *(undefined8 *)(in_RDI + 0xee0) = 0;
    *(undefined4 *)(in_RDI + 0xedc) = 0;
    *(undefined4 *)(in_RDI + 0xed8) = 0;
    *(undefined4 *)(in_RDI + 0xf18) = 0xffffffff;
    *(undefined8 *)(in_RDI + 0xf20) = 0x7ff0000000000000;
    *(undefined8 *)(in_RDI + 0xf28) = 0x7ff0000000000000;
    *(undefined8 *)(in_RDI + 0xf30) = 0x7ff0000000000000;
    *(undefined8 *)(in_RDI + 0xf38) = 0x7ff0000000000000;
    *(undefined1 *)(in_RDI + 8) = 1;
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (size_type)in_stack_fffffffffffffef8,(value_type_conflict1 *)0x4e9314);
  }
  HighsInfo::~HighsInfo((HighsInfo *)CONCAT44(in_ESI,in_stack_ffffffffffffff00));
  return in_ESI;
}

Assistant:

HighsStatus Highs::returnFromLexicographicOptimization(
    HighsStatus return_status, HighsInt original_lp_num_row) {
  // Save model_status_ and info_ since they are cleared by calling
  // deleteRows
  HighsModelStatus model_status = this->model_status_;
  HighsInfo info = this->info_;
  HighsInt num_linear_objective = this->multi_linear_objective_.size();
  if (num_linear_objective > 1) {
    this->deleteRows(original_lp_num_row, this->model_.lp_.num_row_ - 1);
    // Recover model_status_ and info_, and then account for lack of basis or
    // dual solution
    this->model_status_ = model_status;
    this->info_ = info;
    info_.objective_function_value = 0;
    info_.basis_validity = kBasisValidityInvalid;
    info_.dual_solution_status = kSolutionStatusNone;
    info_.num_dual_infeasibilities = kHighsIllegalInfeasibilityCount;
    info_.max_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;
    info_.sum_dual_infeasibilities = kHighsIllegalInfeasibilityMeasure;
    info_.max_complementarity_violation = kHighsIllegalComplementarityViolation;
    info_.sum_complementarity_violations =
        kHighsIllegalComplementarityViolation;
    this->solution_.value_valid = true;
    this->model_.lp_.col_cost_.assign(this->model_.lp_.num_col_, 0);
  }
  return return_status;
}